

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManEquivSetColor_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fOdds)

{
  Gia_Rpr_t GVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  int iVar10;
  
  iVar10 = 0;
  do {
    pGVar8 = p->pObjs;
    if (pObj < pGVar8) {
LAB_00694d86:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar4 = 0x80000000;
    if (fOdds == 0) {
      uVar4 = 0x40000000;
    }
    iVar6 = p->nObjs;
    while( true ) {
      if (pGVar8 + iVar6 <= pObj) goto LAB_00694d86;
      iVar6 = (int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555;
      GVar1 = p->pReprs[iVar6];
      bVar3 = GVar1._3_1_;
      p->pReprs[iVar6] = (Gia_Rpr_t)((uint)GVar1 | uVar4);
      bVar5 = bVar3 >> 6 & 1;
      if (fOdds != 0) {
        bVar5 = bVar3 >> 7;
      }
      if (bVar5 != 0) {
        return iVar10;
      }
      uVar7 = (uint)*(undefined8 *)pObj;
      if ((~uVar7 & 0x9fffffff) != 0) break;
      uVar9 = (uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff;
      iVar6 = p->vCis->nSize;
      if ((int)uVar9 < iVar6 - p->nRegs) break;
      iVar2 = p->vCos->nSize;
      uVar9 = (iVar2 - iVar6) + uVar9;
      if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar9];
      if (((long)iVar2 < 0) || (iVar6 = p->nObjs, iVar6 <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar8 = p->pObjs;
      pObj = pGVar8 + iVar2 + -(ulong)((uint)*(undefined8 *)(pGVar8 + iVar2) & 0x1fffffff);
      iVar10 = iVar10 + 1;
      if (pObj < pGVar8) goto LAB_00694d86;
    }
    if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                    ,0x2a4,"int Gia_ManEquivSetColor_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    iVar6 = Gia_ManEquivSetColor_rec(p,pObj + -(ulong)(uVar7 & 0x1fffffff),fOdds);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    iVar10 = iVar10 + iVar6 + 1;
  } while( true );
}

Assistant:

int Gia_ManEquivSetColor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fOdds )
{
    if ( Gia_ObjVisitColor( p, Gia_ObjId(p,pObj), fOdds ) )
        return 0;
    if ( Gia_ObjIsRo(p, pObj) )
        return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj)), fOdds );
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), fOdds )
             + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin1(pObj), fOdds );
}